

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cvui.h
# Opt level: O2

void cvui::render::button(cvui_block_t *theBlock,int theState,Rect *theShape,String *theLabel)

{
  Matx<double,_4,_1> local_a8;
  int local_88;
  int iStack_84;
  int iStack_80;
  int iStack_7c;
  undefined4 local_70 [2];
  cvui_block_t *local_68;
  undefined8 local_60;
  int local_58;
  int iStack_54;
  int iStack_50;
  int iStack_4c;
  undefined8 local_48;
  undefined8 uStack_40;
  
  local_60 = 0;
  local_70[0] = 0x3010000;
  local_48._0_4_ = theShape->x;
  local_48._4_4_ = theShape->y;
  uStack_40._0_4_ = theShape->width;
  uStack_40._4_4_ = theShape->height;
  local_68 = theBlock;
  cv::Matx<double,_4,_1>::Matx(&local_a8);
  local_a8.val[0] = 41.0;
  local_a8.val[1] = 41.0;
  local_a8.val[2] = 41.0;
  local_a8.val[3] = 0.0;
  cv::rectangle(local_70,&local_48,&local_a8,1,8,0);
  local_58 = theShape->x + 1;
  iStack_54 = theShape->y + 1;
  iStack_50 = theShape->width + -2;
  iStack_4c = theShape->height + -2;
  theShape->x = local_58;
  theShape->y = iStack_54;
  theShape->width = iStack_50;
  theShape->height = iStack_4c;
  local_60 = 0;
  local_70[0] = 0x3010000;
  local_68 = theBlock;
  cv::Matx<double,_4,_1>::Matx(&local_a8);
  local_a8.val[0] = 74.0;
  local_a8.val[1] = 74.0;
  local_a8.val[2] = 74.0;
  local_a8.val[3] = 0.0;
  cv::rectangle(local_70,&local_58,&local_a8,1,8,0);
  local_88 = theShape->x + 1;
  iStack_84 = theShape->y + 1;
  iStack_80 = theShape->width + -2;
  iStack_7c = theShape->height + -2;
  theShape->x = local_88;
  theShape->y = iStack_84;
  theShape->width = iStack_80;
  theShape->height = iStack_7c;
  local_60 = 0;
  local_70[0] = 0x3010000;
  local_68 = theBlock;
  cv::Matx<double,_4,_1>::Matx(&local_a8);
  if (theState == 4) {
    local_a8.val[0] = 82.0;
    local_a8.val[1] = 82.0;
  }
  else if (theState == 5) {
    local_a8.val[0] = 66.0;
    local_a8.val[1] = 66.0;
  }
  else {
    local_a8.val[0] = 50.0;
    local_a8.val[1] = 50.0;
  }
  local_a8.val[3] = 0.0;
  local_a8.val[2] = local_a8.val[1];
  cv::rectangle(local_70,&local_88,&local_a8,0xffffffffffffffff,8,0);
  return;
}

Assistant:

void button(cvui_block_t& theBlock, int theState, cv::Rect& theShape, const cv::String& theLabel) {
		// Outline
		cv::rectangle(theBlock.where, theShape, cv::Scalar(0x29, 0x29, 0x29));

		// Border
		theShape.x++; theShape.y++; theShape.width -= 2; theShape.height -= 2;
		cv::rectangle(theBlock.where, theShape, cv::Scalar(0x4A, 0x4A, 0x4A));

		// Inside
		theShape.x++; theShape.y++; theShape.width -= 2; theShape.height -= 2;
		cv::rectangle(theBlock.where, theShape, theState == OUT ? cv::Scalar(0x42, 0x42, 0x42) : (theState == OVER ? cv::Scalar(0x52, 0x52, 0x52) : cv::Scalar(0x32, 0x32, 0x32)), CVUI_FILLED);
	}